

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O0

void __thiscall
portability_path_test_portability_path_test_canonical_middle_double_dot_break_Test::
~portability_path_test_portability_path_test_canonical_middle_double_dot_break_Test
          (portability_path_test_portability_path_test_canonical_middle_double_dot_break_Test *this)

{
  void *in_RDI;
  
  ~portability_path_test_portability_path_test_canonical_middle_double_dot_break_Test
            ((portability_path_test_portability_path_test_canonical_middle_double_dot_break_Test *)
             0x1221d8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_canonical_middle_double_dot_break)
{
	static const char path[] = "../a/b/../../../c";
	static const char result[] = "c";

	string_path canonical;

	size_t size = portability_path_canonical(path, sizeof(path), canonical, PATH_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(canonical, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}